

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_overlay.cpp
# Opt level: O3

void __thiscall r_exec::HLPOverlay::~HLPOverlay(HLPOverlay *this)

{
  ~HLPOverlay(this);
  operator_delete(this);
  return;
}

Assistant:

HLPOverlay::~HLPOverlay()
{
}